

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

string * __thiscall
Problem::getStringFromState_abi_cxx11_(string *__return_storage_ptr__,Problem *this,State *state)

{
  int __val;
  uint uVar1;
  pointer pnVar2;
  string *psVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  double __val_00;
  string currString;
  vector<int,_std::allocator<int>_> bidNos;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"{",(allocator *)&currString);
  State::getBidNumbers(&bidNos,state);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)bidNos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)bidNos.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    __val = bidNos.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar5];
    lVar7 = (long)__val;
    if (0 < lVar7) {
      std::__cxx11::string::string((string *)&currString,"[",(allocator *)&local_90);
      pnVar2 = this->problemData[uVar5].super__Vector_base<node,_std::allocator<node>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar1 = pnVar2[lVar7].norc;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        std::__cxx11::to_string(&local_b0,pnVar2[lVar7].region[uVar6]);
        std::operator+(&local_90,&local_b0," ");
        std::__cxx11::string::append((string *)&currString);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::replace((ulong)&currString,currString._M_string_length - 1,(char *)0x1);
      psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&local_90,(int)uVar5);
      pcVar4 = (char *)std::__cxx11::string::append(psVar3);
      psVar3 = (string *)std::__cxx11::string::append(pcVar4);
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_50," ",&local_70);
      std::operator+(&local_b0,&local_50,": ");
      psVar3 = (string *)std::__cxx11::string::append(psVar3);
      pcVar4 = (char *)std::__cxx11::string::append(psVar3);
      std::__cxx11::string::append(pcVar4);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&currString);
    }
  }
  psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  State::getBidNumbers((vector<int,_std::allocator<int>_> *)&local_c8,state);
  __val_00 = getStateCost(this,(vector<int,_std::allocator<int>_> *)&local_c8);
  std::__cxx11::to_string(&currString,__val_00);
  std::__cxx11::string::append(psVar3);
  std::__cxx11::string::~string((string *)&currString);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bidNos.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string Problem::getStringFromState(State state) {
    string stateString = "{";
    vector<int> bidNos = state.getBidNumbers();
    for (int i = 0; i < bidNos.size(); ++i) {
        int curBidNumber = bidNos[i];
        if(curBidNumber>0){
            string currString = "[";
            int *curRegions = this->problemData[i][curBidNumber].region;
            int curRegionsSize = this->problemData[i][curBidNumber].norc;
            for (int j = 0; j < curRegionsSize; j++) {
                currString.append(to_string(curRegions[j]) + " ");
            }
            currString.replace(currString.length()-1, 1, "]");
            stateString.append("(").append(to_string(i)).append(",").append(" "+to_string(curBidNumber)+": ").append(currString).append(")");
        }
    }
    stateString.append("}").append(to_string(getStateCost(state.getBidNumbers())));
    return stateString;
}